

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2svg.cpp
# Opt level: O0

void drawLines(ostream *out,MidiFile *midifile,vector<double,_std::allocator<double>_> *hues,
              Options *options)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  MidiEventList *pMVar4;
  reference pvVar5;
  ostream *poVar6;
  MidiEvent *this;
  int local_dc;
  int j;
  double dwidth;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string color;
  int i;
  int track;
  allocator local_51;
  string local_50;
  uint local_2c;
  Options *pOStack_28;
  int dashing;
  Options *options_local;
  vector<double,_std::allocator<double>_> *hues_local;
  MidiFile *midifile_local;
  ostream *out_local;
  
  pOStack_28 = options;
  options_local = (Options *)hues;
  hues_local = (vector<double,_std::allocator<double>_> *)midifile;
  midifile_local = (MidiFile *)out;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"dash",&local_51);
  bVar2 = smf::Options::getBoolean(options,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_2c = (uint)bVar2;
  color.field_2._12_4_ = smf::MidiFile::size((MidiFile *)hues_local);
  while (color.field_2._12_4_ = color.field_2._12_4_ + -1, -1 < (int)color.field_2._12_4_) {
    pMVar4 = smf::MidiFile::operator[]((MidiFile *)hues_local,color.field_2._12_4_);
    iVar3 = hasNotes(pMVar4);
    uVar1 = color.field_2._12_4_;
    if (iVar3 != 0) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)options_local,
                          (long)(int)color.field_2._12_4_);
      std::__cxx11::to_string((string *)&dwidth,*pvVar5);
      std::operator+(&local_b0,"hsl(",(string *)&dwidth);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     &local_b0,", 100%, 75%)");
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&dwidth);
      if (bwQ != 0) {
        std::__cxx11::string::operator=((string *)local_90,(string *)&StaffColor_abi_cxx11_);
      }
      poVar6 = std::operator<<((ostream *)midifile_local,"\t\t<g");
      poVar6 = std::operator<<(poVar6," class=\"note-lines track-");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar1);
      poVar6 = std::operator<<(poVar6,"\"");
      poVar6 = std::operator<<(poVar6," fill=\"none\" stroke=\"");
      poVar6 = std::operator<<(poVar6,(string *)local_90);
      std::operator<<(poVar6,"\"");
      if (local_2c != 0) {
        poVar6 = std::operator<<((ostream *)midifile_local," stroke-dasharray=\"");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,2.25);
        std::operator<<(poVar6,"\"");
        std::operator<<((ostream *)midifile_local," vector-effect=\"non-scaling-stroke\"");
      }
      poVar6 = std::operator<<((ostream *)midifile_local," stroke-width=\"");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,LineThickness);
      std::operator<<(poVar6,"\">\n");
      local_dc = 0;
      while( true ) {
        pMVar4 = smf::MidiFile::operator[]((MidiFile *)hues_local,color.field_2._12_4_);
        iVar3 = smf::MidiEventList::size(pMVar4);
        if (iVar3 <= local_dc) break;
        pMVar4 = smf::MidiFile::operator[]((MidiFile *)hues_local,color.field_2._12_4_);
        this = smf::MidiEventList::operator[](pMVar4,local_dc);
        bVar2 = smf::MidiMessage::isNoteOn(&this->super_MidiMessage);
        if (bVar2) {
          printLineToNextNote((ostream *)midifile_local,(MidiFile *)hues_local,color.field_2._12_4_,
                              local_dc,pOStack_28);
        }
        local_dc = local_dc + 1;
      }
      std::operator<<((ostream *)midifile_local,"\t\t</g>\n");
      std::__cxx11::string::~string((string *)local_90);
    }
  }
  return;
}

Assistant:

void drawLines(ostream& out, MidiFile& midifile, vector<double>& hues,
      Options& options) {
   int dashing = options.getBoolean("dash");
   int track = 0;
   for (int i=midifile.size()-1; i>=0; i--) {
      if (!hasNotes(midifile[i])) {
         continue;
      }
      track = i;
      string color = "hsl(" + to_string(hues[i]) + ", 100%, 75%)";
      if (bwQ) {
         color = StaffColor;
      }
      out << "\t\t<g"
          << " class=\"note-lines track-" << track << "\""
          << " fill=\"none\" stroke=\"" << color << "\"";

      // double scale = options.getDouble("scale");
      if (dashing) {
         double dwidth = 2.25;
         out << " stroke-dasharray=\"" << dwidth << "\"";
         out << " vector-effect=\"non-scaling-stroke\"";
      }
      out << " stroke-width=\""<< LineThickness << "\">\n";
      for (int j=0; j<midifile[i].size(); j++) {
         if (!midifile[i][j].isNoteOn()) {
            continue;
         }
         printLineToNextNote(out, midifile, i, j, options);
      }
      out << "\t\t</g>\n";
   }
}